

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

int __thiscall
slang::SmallVectorBase<slang::ast::Expression_*>::copy
          (SmallVectorBase<slang::ast::Expression_*> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  size_type sVar1;
  pointer ppEVar2;
  byte *pbVar3;
  long __d2;
  long lVar4;
  long lVar5;
  
  sVar1 = this->len;
  if (sVar1 != 0) {
    pbVar3 = (byte *)(*(long *)(*(long *)dst + 8) + 7U & 0xfffffffffffffff8);
    if (*(byte **)(dst + 8) < pbVar3 + sVar1 * 8) {
      pbVar3 = BumpAllocator::allocateSlow((BumpAllocator *)dst,sVar1 << 3,8);
    }
    else {
      *(byte **)(*(long *)dst + 8) = pbVar3 + sVar1 * 8;
    }
    if (0 < (long)this->len) {
      ppEVar2 = this->data_;
      lVar4 = this->len + 1;
      lVar5 = 0;
      do {
        *(undefined8 *)(pbVar3 + lVar5) = *(undefined8 *)((long)ppEVar2 + lVar5);
        lVar4 = lVar4 + -1;
        lVar5 = lVar5 + 8;
      } while (1 < lVar4);
    }
    return (int)pbVar3;
  }
  return 0;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }